

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall
duckdb_parquet::ColumnCryptoMetaData::__set_ENCRYPTION_WITH_COLUMN_KEY
          (ColumnCryptoMetaData *this,EncryptionWithColumnKey *val)

{
  EncryptionWithColumnKey::operator=(&this->ENCRYPTION_WITH_COLUMN_KEY,val);
  this->__isset = (_ColumnCryptoMetaData__isset)((byte)this->__isset | 2);
  return;
}

Assistant:

void ColumnCryptoMetaData::__set_ENCRYPTION_WITH_COLUMN_KEY(const EncryptionWithColumnKey& val) {
  this->ENCRYPTION_WITH_COLUMN_KEY = val;
__isset.ENCRYPTION_WITH_COLUMN_KEY = true;
}